

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O0

int curl_strnequal(char *first,char *second,size_t max)

{
  undefined1 local_29;
  size_t max_local;
  char *second_local;
  char *first_local;
  
  if ((first == (char *)0x0) || (second == (char *)0x0)) {
    local_29 = false;
    if ((first == (char *)0x0) && (local_29 = false, second == (char *)0x0)) {
      local_29 = max != 0;
    }
    first_local._4_4_ = (uint)local_29;
  }
  else {
    first_local._4_4_ = ncasecompare(first,second,max);
  }
  return first_local._4_4_;
}

Assistant:

int curl_strnequal(const char *first, const char *second, size_t max)
{
  if(first && second)
    /* both pointers point to something then compare them */
    return ncasecompare(first, second, max);

  /* if both pointers are NULL then treat them as equal if max is non-zero */
  return (NULL == first && NULL == second && max);
}